

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_impl.cpp
# Opt level: O1

void __thiscall ui::GPIOImpl::BuildUI(GPIOImpl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  ComponentBase *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  GPIOImpl *this_01;
  long *plVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ConstStringListRef entries;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  string gpio_path;
  shared_ptr<ui::Gpio> gpio;
  MenuOption menuOpt;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [48];
  value_type local_388;
  GPIOImpl *local_378;
  int *local_370;
  Ref<ftxui::MenuOption> *local_368;
  pointer local_360;
  directory_iterator local_358;
  directory_iterator local_348;
  Component local_338;
  vector<std::shared_ptr<ui::Gpio>,_std::allocator<std::shared_ptr<ui::Gpio>_>_> *local_328;
  Component local_320;
  int *local_310 [2];
  long local_300 [2];
  pointer local_2f0;
  Ref<ftxui::MenuOption> *local_2e8;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_2e0;
  Components local_2c8;
  MenuOption local_2a8;
  undefined1 local_1d8 [208];
  MenuOption local_108;
  undefined8 local_38;
  
  ftxui::MenuOption::MenuOption((MenuOption *)local_1d8);
  local_3b8._0_8_ = this;
  std::function<void()>::operator=
            ((function<void()> *)(local_1d8 + 0xa0),(anon_class_8_1_8991fb9c *)local_3b8);
  ftxui::MenuOption::MenuOption(&local_2a8,(MenuOption *)local_1d8);
  ftxui::MenuOption::MenuOption(&local_108,&local_2a8);
  local_368 = (Ref<ftxui::MenuOption> *)&this->selected;
  local_38 = 0;
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)&this->gpio_names;
  entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b8;
  ftxui::Menu(entries,(int *)0x0,local_368);
  uVar4 = local_3b8._8_8_;
  uVar3 = local_3b8._0_8_;
  local_3b8._0_8_ = (GPIOImpl *)0x0;
  local_3b8._8_8_ = (pointer)0x0;
  p_Var1 = (this->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  (this->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((pointer)local_3b8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
  }
  ftxui::MenuOption::~MenuOption(&local_108);
  ftxui::MenuOption::~MenuOption(&local_2a8);
  local_2c8.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ftxui::Container::Vertical((Container *)local_3b8,&local_2c8,(int *)local_368);
  uVar4 = local_3b8._8_8_;
  uVar3 = local_3b8._0_8_;
  local_3b8._0_8_ = (GPIOImpl *)0x0;
  local_3b8._8_8_ = (pointer)0x0;
  p_Var1 = (this->gpio_individual).
           super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->gpio_individual).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar3;
  (this->gpio_individual).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((pointer)local_3b8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_2c8);
  std::filesystem::__cxx11::path::path<char[17],std::filesystem::__cxx11::path>
            ((path *)local_3b8,(char (*) [17])"/sys/class/gpio/",auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_348,(path *)local_3b8,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path((path *)local_3b8);
  if (local_348._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_348._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_348._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_348._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_348._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_358._M_dir._M_ptr = local_348._M_dir._M_ptr;
  local_358._M_dir._M_refcount._M_pi = local_348._M_dir._M_refcount._M_pi;
  if (local_348._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_348._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_348._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_348._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_348._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_348._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_348._M_dir._M_refcount._M_pi);
    }
  }
  local_370 = &this->tab;
  local_360 = (pointer)&this->limit;
  local_328 = &this->children_;
  local_378 = this;
  while( true ) {
    this_01 = local_378;
    if (local_358._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
    break;
    plVar5 = (long *)std::filesystem::__cxx11::directory_iterator::operator*(&local_358);
    local_3b8._0_8_ = (GPIOImpl *)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char*>((string *)local_3b8,*plVar5,plVar5[1] + *plVar5);
    lVar6 = std::__cxx11::string::find((char *)local_3b8,0x1573a1,0);
    if ((lVar6 == -1) &&
       (lVar6 = std::__cxx11::string::find((char *)local_3b8,0x1573aa,0), lVar6 != -1)) {
      local_310[0] = local_370;
      local_2e8 = local_368;
      local_2f0 = local_360;
      local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ui::Gpio,std::allocator<ui::Gpio>,std::__cxx11::string&,int*,int*,int*>
                (&local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Gpio **)&local_388,(allocator<ui::Gpio> *)((long)&uStack_3c0 + 7),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                 local_310,(int **)&local_2e8,(int **)&local_2f0);
      pcVar2 = ((local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->label_)
               ._M_dataplus._M_p;
      local_310[0] = (int *)local_300;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,pcVar2,
                 pcVar2 + ((local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->label_)._M_string_length);
      lVar6 = std::__cxx11::string::find((char *)local_310,0x1573af,0);
      if ((long *)local_310[0] != local_300) {
        operator_delete(local_310[0],local_300[0] + 1);
      }
      if (lVar6 != -1) {
        std::vector<std::shared_ptr<ui::Gpio>,_std::allocator<std::shared_ptr<ui::Gpio>_>_>::
        push_back(local_328,&local_388);
        this_00 = (local_378->gpio_individual).
                  super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_338.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &(local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ComponentBase;
        local_338.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ftxui::ComponentBase::Add(this_00,&local_338);
        if (local_338.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_338.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        *(int *)&(local_360->_M_dataplus)._M_p = *(int *)&(local_360->_M_dataplus)._M_p + 1;
      }
      if (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_388.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    if ((GPIOImpl *)local_3b8._0_8_ != (GPIOImpl *)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_358);
  }
  if (local_348._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348._M_dir._M_refcount._M_pi);
  }
  local_3b8._0_8_ =
       (this_01->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b8._8_8_ =
       (this_01->gpio_menu).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((pointer)local_3b8._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((pointer)local_3b8._8_8_)->_M_string_length =
           (int)((pointer)local_3b8._8_8_)->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&((pointer)local_3b8._8_8_)->_M_string_length =
           (int)((pointer)local_3b8._8_8_)->_M_string_length + 1;
    }
  }
  local_3b8._16_8_ =
       (this_01->gpio_individual).
       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3b8._24_8_ =
       (this_01->gpio_individual).
       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._24_8_)->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)local_3b8;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_2e0,__l,(allocator_type *)local_310);
  ftxui::Container::Tab((Container *)&local_320,&local_2e0,local_370);
  ftxui::ComponentBase::Add((ComponentBase *)this_01,&local_320);
  if (local_320.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_320.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_2e0);
  lVar6 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_3c0 + lVar6) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_3c0 + lVar6));
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  ftxui::MenuOption::~MenuOption((MenuOption *)local_1d8);
  return;
}

Assistant:

void BuildUI() {
    MenuOption menuOpt;
    menuOpt.on_enter = [&] { tab = 1; };
    gpio_menu = Menu(&gpio_names, &selected, menuOpt);
    gpio_individual = Container::Vertical({}, &selected);
    for (const auto& it :
         std::filesystem::directory_iterator("/sys/class/gpio/")) {
      std::string gpio_path = it.path();
      if (gpio_path.find("gpiochip") == std::string::npos &&
          gpio_path.find("gpio") != std::string::npos) {
        auto gpio = std::make_shared<Gpio>(gpio_path, &tab, &selected, &limit);
        if (gpio->label().find("P") != std::string::npos) {
          children_.push_back(gpio);
          gpio_individual->Add(gpio);
          limit++;
        }
      }
    }

    Add(Container::Tab(
        {
            gpio_menu,
            gpio_individual,
        },
        &tab));
  }